

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_hash.h
# Opt level: O1

size_t __thiscall
std::hash<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>::operator()
          (hash<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> *this,
          AlgebraicExpression<mp::QuadAndLinTerms> *x)

{
  size_t sVar1;
  ulong uVar2;
  hash<mp::QuadAndLinTerms> local_1a;
  hash<double> local_19;
  
  sVar1 = hash<mp::QuadAndLinTerms>::operator()(&local_1a,&x->super_QuadAndLinTerms);
  uVar2 = sVar1 + 0x9e3779b9;
  sVar1 = hash<double>::operator()(&local_19,x->constant_term_);
  return sVar1 + (uVar2 >> 2) + uVar2 * 0x40 + 0x9e3779b9 ^ uVar2;
}

Assistant:

size_t operator()(
      const mp::AlgebraicExpression<Body>& x) const
  {
    mp::HashStreamer hs;
    hs.Add(std::hash<Body>{}(x.GetBody()));
    hs.Add(x.constant_term());
    return hs.FinalizeHashValue();
  }